

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hdr_histogram_log.c
# Opt level: O1

int apply_to_counts_zz(hdr_histogram *h,uint8_t *counts_data,int32_t data_limit)

{
  bool bVar1;
  int iVar2;
  long in_RAX;
  int iVar3;
  long lVar4;
  int64_t value;
  long local_38;
  
  if (data_limit < 1) {
    lVar4 = 0;
  }
  else {
    iVar3 = 0;
    lVar4 = 0;
    local_38 = in_RAX;
    do {
      if (h->counts_len <= iVar3) {
        iVar3 = -0x7526;
        goto LAB_00106307;
      }
      iVar2 = zig_zag_decode_i64(counts_data + lVar4,&local_38);
      if (local_38 < 0) {
        if ((local_38 < -0x7fffffff) || ((long)h->counts_len < iVar3 - local_38)) {
          bVar1 = false;
        }
        else {
          iVar3 = iVar3 - (int)local_38;
          bVar1 = true;
        }
        if (!bVar1) {
          return -0x7528;
        }
      }
      else {
        h->counts[iVar3] = local_38;
        iVar3 = iVar3 + 1;
      }
      lVar4 = lVar4 + iVar2;
    } while (lVar4 < data_limit);
  }
  iVar3 = 0;
LAB_00106307:
  iVar2 = -0x7527;
  if (lVar4 <= data_limit) {
    iVar2 = iVar3;
  }
  return iVar2;
}

Assistant:

static int apply_to_counts_zz(struct hdr_histogram* h, const uint8_t* counts_data, const int32_t data_limit)
{
    int64_t data_index = 0;
    int32_t counts_index = 0;
    int64_t value;

    while (data_index < data_limit && counts_index < h->counts_len)
    {
        data_index += zig_zag_decode_i64(&counts_data[data_index], &value);

        if (value < 0)
        {
            int64_t zeros = -value;

            if (value <= INT32_MIN || counts_index + zeros > h->counts_len)
            {
                return HDR_TRAILING_ZEROS_INVALID;
            }

            counts_index += (int32_t) zeros;
        }
        else
        {
            h->counts[counts_index] = value;
            counts_index++;
        }
    }

    if (data_index > data_limit)
    {
        return HDR_VALUE_TRUNCATED;
    }
    else if (data_index < data_limit)
    {
        return HDR_ENCODED_INPUT_TOO_LONG;
    }

    return 0;
}